

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O1

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar1;
  ulong uVar2;
  pointer *ppuVar3;
  PrimitiveMode PVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  iterator iVar8;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar9;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar10;
  BufferView *pBVar11;
  vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *pvVar12;
  long lVar13;
  aiScene *paVar14;
  long lVar15;
  bool bVar16;
  Object *pOVar17;
  _Alloc_hider _Var18;
  iterator iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  pointer ppMVar25;
  aiMesh *paVar26;
  pointer pRVar27;
  float *pfVar28;
  ulong *puVar29;
  uint *puVar30;
  undefined4 *puVar31;
  Logger *pLVar32;
  aiFace *paVar33;
  int *piVar34;
  undefined8 *puVar35;
  aiMesh **ppaVar36;
  runtime_error *prVar37;
  long *plVar38;
  ulong uVar39;
  Accessor *pAVar40;
  char *pcVar41;
  ulong uVar42;
  aiFace *paVar43;
  aiMesh **ppaVar44;
  ulong uVar45;
  int iVar46;
  ulong uVar47;
  char *pcVar48;
  pointer pPVar49;
  ulong *puVar50;
  ulong uVar51;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar52;
  bool bVar53;
  Ref<glTF::Buffer> RVar54;
  uint k;
  Indexer data;
  aiMesh *aim;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  uint local_e4;
  Mesh *local_e0;
  Indexer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  aiMesh **local_98;
  iterator iStack_90;
  aiMesh **local_88;
  ulong local_78;
  uint local_6c;
  Asset *local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_60;
  LazyDict<glTF::Buffer> *local_58;
  string local_50;
  
  local_98 = (aiMesh **)0x0;
  iStack_90._M_current = (aiMesh **)0x0;
  local_88 = (aiMesh **)0x0;
  local_e4 = 0;
  ppMVar25 = (r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_68 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar25 & 0x7fffffff8U) != 0) {
    local_58 = &r->buffers;
    local_60 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar51 = 0;
    do {
      local_e0 = ppMVar25[uVar51];
      if (*(size_t *)
           ((long)&(local_e0->Extension).
                   super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                   ._M_impl + 0x10) != 0) {
        plVar1 = &local_e0->Extension;
        pOVar17 = &local_e0->super_Object;
        plVar52 = plVar1;
        while (plVar52 = *(list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           **)&(plVar52->
                               super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                               )._M_impl._M_node, plVar52 != plVar1) {
          sVar7 = *(size_t *)
                   ((long)&(plVar52->
                           super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           )._M_impl._M_node + 0x10);
          if (*(int *)(sVar7 + 8) != 0) {
            prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<glTF::Mesh::SExtension::EType>(&local_50,*(EType *)(sVar7 + 8));
            std::operator+(&local_b8,"GLTF: Can not import mesh: unknown mesh extension (code: \"",
                           &local_50);
            plVar38 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_d8.accessor = (Accessor *)*plVar38;
            pAVar40 = (Accessor *)(plVar38 + 2);
            if (local_d8.accessor == pAVar40) {
              local_d8.elemSize = (size_t)(pAVar40->super_Object)._vptr_Object;
              local_d8.stride = plVar38[3];
              local_d8.accessor = (Accessor *)&local_d8.elemSize;
            }
            else {
              local_d8.elemSize = (size_t)(pAVar40->super_Object)._vptr_Object;
            }
            local_d8.data = (uint8_t *)plVar38[1];
            *plVar38 = (long)pAVar40;
            plVar38[1] = 0;
            *(undefined1 *)(plVar38 + 2) = 0;
            std::runtime_error::runtime_error(prVar37,(string *)&local_d8);
            *(undefined ***)prVar37 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar37,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (2 < (ulong)(((long)*(pointer *)
                                  ((long)&(local_e0->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(local_e0->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_d8.accessor = (Accessor *)&local_d8.elemSize;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,
                       "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                       ,"");
            std::runtime_error::runtime_error(prVar37,(string *)&local_d8);
            *(undefined ***)prVar37 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar37,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          RVar54 = glTF::LazyDict<glTF::Buffer>::Get(local_58,*(char **)(sVar7 + 0x10));
          glTF::Buffer::EncodedRegion_SetCurrent
                    (((RVar54.vector)->
                     super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[RVar54._8_8_ & 0xffffffff],&pOVar17->id);
        }
      }
      iVar8._M_current =
           (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_60,iVar8,&local_e4);
      }
      else {
        *iVar8._M_current = local_e4;
        ppuVar3 = &(this->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      local_e4 = local_e4 +
                 (int)((ulong)((long)*(pointer *)
                                      ((long)&(local_e0->primitives).
                                              super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                              ._M_impl + 8) -
                              *(long *)&(local_e0->primitives).
                                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                        ._M_impl.super__Vector_impl_data) >> 4) * -0x3b13b13b;
      pPVar49 = (local_e0->primitives).
                super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(local_e0->primitives).
                   super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                   ._M_impl + 8) != pPVar49) {
        local_78 = 0;
        do {
          paVar26 = (aiMesh *)operator_new(0x520);
          paVar26->mPrimitiveTypes = 0;
          paVar26->mNumVertices = 0;
          paVar26->mNumFaces = 0;
          memset(&paVar26->mVertices,0,0xcc);
          paVar26->mBones = (aiBone **)0x0;
          paVar26->mMaterialIndex = 0;
          (paVar26->mName).length = 0;
          (paVar26->mName).data[0] = '\0';
          memset((paVar26->mName).data + 1,0x1b,0x3ff);
          paVar26->mNumAnimMeshes = 0;
          paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar26->mMethod = 0;
          (paVar26->mAABB).mMin.x = 0.0;
          (paVar26->mAABB).mMin.y = 0.0;
          (paVar26->mAABB).mMin.z = 0.0;
          (paVar26->mAABB).mMax.x = 0.0;
          (paVar26->mAABB).mMax.y = 0.0;
          (paVar26->mAABB).mMax.z = 0.0;
          paVar26->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar26->mNumUVComponents[0] = 0;
          paVar26->mNumUVComponents[1] = 0;
          paVar26->mNumUVComponents[2] = 0;
          paVar26->mNumUVComponents[3] = 0;
          paVar26->mNumUVComponents[4] = 0;
          paVar26->mNumUVComponents[5] = 0;
          paVar26->mNumUVComponents[6] = 0;
          paVar26->mNumUVComponents[7] = 0;
          paVar26->mColors[0] = (aiColor4D *)0x0;
          paVar26->mColors[1] = (aiColor4D *)0x0;
          paVar26->mColors[2] = (aiColor4D *)0x0;
          paVar26->mColors[3] = (aiColor4D *)0x0;
          paVar26->mColors[4] = (aiColor4D *)0x0;
          paVar26->mColors[5] = (aiColor4D *)0x0;
          paVar26->mColors[6] = (aiColor4D *)0x0;
          paVar26->mColors[7] = (aiColor4D *)0x0;
          local_b8._M_dataplus._M_p = (pointer)paVar26;
          if (iStack_90._M_current == local_88) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_98,iStack_90,
                       (aiMesh **)&local_b8);
          }
          else {
            *iStack_90._M_current = paVar26;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          _Var18._M_p = local_b8._M_dataplus._M_p;
          uVar42 = (local_e0->super_Object).id._M_string_length;
          if (uVar42 < 0x400) {
            ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length = (uint)uVar42;
            memcpy(local_b8._M_dataplus._M_p + 0xf0,(local_e0->super_Object).id._M_dataplus._M_p,
                   uVar42);
            _Var18._M_p[uVar42 + 0xf0] = '\0';
          }
          if (1 < (ulong)(((long)*(pointer *)
                                  ((long)&(local_e0->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(local_e0->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            uVar23 = ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length;
            local_b8._M_dataplus._M_p[(ulong)uVar23 + 0xf0] = '-';
            pcVar48 = local_b8._M_dataplus._M_p + (ulong)uVar23 + 0xf1;
            uVar20 = 1;
            uVar42 = local_78 & 0xffffffff;
            if (((int)local_78 < 0) && (1 < 0x3ff - uVar23)) {
              local_b8._M_dataplus._M_p[(ulong)uVar23 + 0xf1] = '-';
              pcVar48 = local_b8._M_dataplus._M_p + (ulong)uVar23 + 0xf2;
              uVar42 = (ulong)(uint)-(int)local_78;
              uVar20 = 2;
            }
            iVar46 = 1000000000;
            bVar53 = false;
            do {
              pcVar41 = pcVar48;
              if (0x3ff - uVar23 <= uVar20) break;
              lVar15 = (long)(int)uVar42 / (long)iVar46;
              uVar39 = (long)(int)uVar42 % (long)iVar46 & 0xffffffff;
              if (((bVar53) || (iVar46 == 1)) || ((int)lVar15 != 0)) {
                pcVar41 = pcVar48 + 1;
                uVar20 = uVar20 + 1;
                *pcVar48 = (char)lVar15 + '0';
                bVar53 = true;
                uVar42 = uVar39;
                pcVar48 = pcVar41;
                if (iVar46 != 1) goto LAB_0065b643;
                bVar16 = false;
                iVar46 = 1;
              }
              else {
LAB_0065b643:
                iVar46 = iVar46 / 10;
                bVar16 = true;
                pcVar41 = pcVar48;
              }
              pcVar48 = pcVar41;
            } while (bVar16);
            *pcVar41 = '\0';
            ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length =
                 ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length + uVar20;
          }
          pPVar49 = pPVar49 + local_78;
          PVar4 = pPVar49->mode;
          if (PVar4 - PrimitiveMode_LINES < 3) {
            uVar23 = 2;
LAB_0065b6aa:
            *(uint *)local_b8._M_dataplus._M_p = *(uint *)local_b8._M_dataplus._M_p | uVar23;
          }
          else {
            if (PVar4 - PrimitiveMode_TRIANGLES < 3) {
              uVar23 = 4;
              goto LAB_0065b6aa;
            }
            uVar23 = 1;
            if (PVar4 == PrimitiveMode_POINTS) goto LAB_0065b6aa;
          }
          pRVar27 = *(pointer *)
                     &(pPVar49->attributes).position.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(pPVar49->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar27) &&
             (pRVar27->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            *(uint *)(local_b8._M_dataplus._M_p + 4) =
                 *(uint *)(*(long *)(*(long *)&(pRVar27->vector->
                                               super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar27->index * 8) + 100);
            puVar35 = *(undefined8 **)
                       &(pPVar49->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl;
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar35 + (ulong)*(uint *)(puVar35 + 1) * 8),
                       (aiVector3t<float> **)(local_b8._M_dataplus._M_p + 0x10));
          }
          pRVar27 = (pPVar49->attributes).normal.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(pPVar49->attributes).normal.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar27) &&
             (pRVar27->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar27->vector->
                                   super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar27->index * 8),
                       (aiVector3t<float> **)(local_b8._M_dataplus._M_p + 0x18));
          }
          pRVar27 = (pPVar49->attributes).texcoord.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pPVar49->attributes).texcoord.
                       super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
               + 8) != pRVar27) {
            uVar42 = 0;
            do {
              glTF::Accessor::ExtractData<aiVector3t<float>>
                        (*(Accessor **)
                          (*(long *)&((pRVar27[uVar42].vector)->
                                     super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar27[uVar42].index * 8),
                         (aiVector3t<float> **)(local_b8._M_dataplus._M_p + uVar42 * 8 + 0x70));
              lVar15 = *(long *)&(pPVar49->attributes).texcoord.
                                 super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                 ._M_impl.super__Vector_impl_data;
              *(undefined4 *)(local_b8._M_dataplus._M_p + uVar42 * 4 + 0xb0) =
                   *(undefined4 *)
                    (&DAT_0082c228 +
                    (ulong)*(uint *)(*(long *)(**(long **)(lVar15 + uVar42 * 0x10) +
                                              (ulong)*(uint *)(lVar15 + 8 + uVar42 * 0x10) * 8) +
                                    0x68) * 0x10);
              if (*(uint *)(local_b8._M_dataplus._M_p + 4) != 0) {
                pfVar28 = (float *)(*(long *)(local_b8._M_dataplus._M_p + uVar42 * 8 + 0x70) + 4);
                uVar39 = 0;
                do {
                  *pfVar28 = 1.0 - *pfVar28;
                  uVar39 = uVar39 + 1;
                  pfVar28 = pfVar28 + 3;
                } while (uVar39 < *(uint *)(local_b8._M_dataplus._M_p + 4));
              }
              if (6 < uVar42) break;
              uVar42 = uVar42 + 1;
              pRVar27 = (pPVar49->attributes).texcoord.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar42 < (ulong)((long)*(pointer *)
                                             ((long)&(pPVar49->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                             + 8) - (long)pRVar27 >> 4));
          }
          pvVar9 = (pPVar49->indices).vector;
          if (pvVar9 == (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
            PVar4 = pPVar49->mode;
            if (PVar4 < (PrimitiveMode_TRIANGLE_FAN|PrimitiveMode_LINES)) {
              uVar23 = *(uint *)(local_b8._M_dataplus._M_p + 4);
              uVar39 = (ulong)uVar23;
              switch(PVar4) {
              case PrimitiveMode_POINTS:
                puVar29 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
                *puVar29 = uVar39;
                paVar43 = (aiFace *)(puVar29 + 1);
                uVar42 = uVar39;
                if (uVar23 != 0) {
                  paVar33 = paVar43;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != paVar43 + uVar39);
                  uVar45 = 0;
                  do {
                    *(undefined4 *)(puVar29 + 1) = 1;
                    puVar31 = (undefined4 *)operator_new__(4);
                    puVar29[2] = (ulong)puVar31;
                    *puVar31 = (int)uVar45;
                    uVar45 = uVar45 + 1;
                    puVar29 = puVar29 + 2;
                  } while (uVar39 != uVar45);
                }
                break;
              case PrimitiveMode_LINES:
                uVar20 = uVar23;
                if ((uVar23 & 0xfffffffe) != uVar23) {
                  pLVar32 = DefaultLogger::get();
                  Logger::warn(pLVar32,
                               "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                              );
                  uVar20 = uVar23 & 0xfffffffe;
                }
                uVar42 = (ulong)(uVar23 >> 1);
                puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
                *puVar29 = uVar42;
                paVar43 = (aiFace *)(puVar29 + 1);
                if (1 < uVar23) {
                  paVar33 = paVar43;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != paVar43 + uVar42);
                }
                if (uVar20 != 0) {
                  uVar39 = 0;
                  do {
                    *(undefined4 *)(puVar29 + uVar39 + 1) = 2;
                    piVar34 = (int *)operator_new__(8);
                    puVar29[uVar39 + 2] = (ulong)piVar34;
                    *piVar34 = (int)uVar39;
                    piVar34[1] = (int)uVar39 + 1;
                    uVar39 = uVar39 + 2;
                  } while (uVar39 < uVar20);
                }
                break;
              default:
                uVar20 = uVar23 - (PVar4 == PrimitiveMode_LINE_STRIP);
                uVar42 = (ulong)uVar20;
                puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
                *puVar29 = uVar42;
                paVar43 = (aiFace *)(puVar29 + 1);
                if (uVar20 != 0) {
                  paVar33 = paVar43;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != paVar43 + uVar42);
                }
                paVar43->mNumIndices = 2;
                puVar35 = (undefined8 *)operator_new__(8);
                puVar29[2] = (ulong)puVar35;
                *puVar35 = 0x100000000;
                if (2 < uVar23) {
                  puVar50 = puVar29 + 4;
                  uVar45 = 2;
                  do {
                    uVar5 = *(undefined4 *)(puVar50[-2] + 4);
                    *(undefined4 *)(puVar50 + -1) = 2;
                    puVar31 = (undefined4 *)operator_new__(8);
                    *puVar50 = (ulong)puVar31;
                    *puVar31 = uVar5;
                    puVar31[1] = (int)uVar45;
                    uVar45 = uVar45 + 1;
                    puVar50 = puVar50 + 2;
                  } while (uVar39 != uVar45);
                }
                if (pPVar49->mode == PrimitiveMode_LINE_LOOP) {
                  uVar20 = *(uint *)(puVar29[(ulong)(uVar23 - 2) * 2 + 2] + 4);
                  uVar22 = *(uint *)puVar29[2];
                  paVar43[uVar23 - 1].mNumIndices = 2;
                  puVar30 = (uint *)operator_new__(8);
                  paVar43[uVar23 - 1].mIndices = puVar30;
                  *puVar30 = uVar20;
                  puVar30[1] = uVar22;
                }
                break;
              case PrimitiveMode_TRIANGLES:
                uVar42 = uVar39 / 3;
                uVar20 = (uVar23 / 3) * 3;
                uVar22 = uVar23;
                if (uVar20 != uVar23) {
                  pLVar32 = DefaultLogger::get();
                  Logger::warn(pLVar32,
                               "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                              );
                  uVar22 = uVar20;
                }
                puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
                *puVar29 = uVar42;
                paVar43 = (aiFace *)(puVar29 + 1);
                if (2 < uVar23) {
                  paVar33 = paVar43;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != paVar43 + uVar42);
                }
                if (uVar22 != 0) {
                  uVar23 = 0;
                  do {
                    uVar39 = (ulong)uVar23 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                    *(undefined4 *)((long)&paVar43->mNumIndices + uVar39) = 3;
                    puVar30 = (uint *)operator_new__(0xc);
                    *(uint **)((long)&paVar43->mIndices + uVar39) = puVar30;
                    *puVar30 = uVar23;
                    puVar30[1] = uVar23 + 1;
                    puVar30[2] = uVar23 + 2;
                    uVar23 = uVar23 + 3;
                  } while (uVar23 < uVar22);
                }
                break;
              case PrimitiveMode_TRIANGLE_STRIP:
                uVar42 = (ulong)(uVar23 - 2);
                puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
                *puVar29 = uVar42;
                paVar43 = (aiFace *)(puVar29 + 1);
                if (uVar23 - 2 != 0) {
                  paVar33 = paVar43;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != paVar43 + uVar42);
                }
                paVar43->mNumIndices = 3;
                puVar35 = (undefined8 *)operator_new__(0xc);
                puVar29[2] = (ulong)puVar35;
                *puVar35 = 0x100000000;
                *(undefined4 *)(puVar35 + 1) = 2;
                if (3 < uVar23) {
                  puVar29 = puVar29 + 3;
                  uVar45 = 3;
                  do {
                    uVar5 = *(undefined4 *)(puVar29[3] + 4);
                    uVar6 = *(undefined4 *)(puVar29[3] + 8);
                    *(undefined4 *)puVar29 = 3;
                    puVar31 = (undefined4 *)operator_new__(0xc);
                    puVar29[1] = (ulong)puVar31;
                    *puVar31 = uVar5;
                    puVar31[1] = uVar6;
                    puVar31[2] = (int)uVar45;
                    uVar45 = uVar45 + 1;
                    puVar29 = puVar29 + 2;
                  } while (uVar39 != uVar45);
                }
                break;
              case PrimitiveMode_TRIANGLE_FAN:
                uVar42 = (ulong)(uVar23 - 2);
                puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
                *puVar29 = uVar42;
                paVar43 = (aiFace *)(puVar29 + 1);
                if (uVar23 - 2 != 0) {
                  paVar33 = paVar43;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != paVar43 + uVar42);
                }
                paVar43->mNumIndices = 3;
                puVar35 = (undefined8 *)operator_new__(0xc);
                puVar29[2] = (ulong)puVar35;
                *puVar35 = 0x100000000;
                *(undefined4 *)(puVar35 + 1) = 2;
                if (3 < uVar23) {
                  puVar50 = puVar29 + 3;
                  uVar45 = 3;
                  do {
                    uVar5 = *(undefined4 *)puVar29[2];
                    uVar6 = *(undefined4 *)(puVar50[3] + 8);
                    *(undefined4 *)puVar50 = 3;
                    puVar31 = (undefined4 *)operator_new__(0xc);
                    puVar50[1] = (ulong)puVar31;
                    *puVar31 = uVar5;
                    puVar31[1] = uVar6;
                    puVar31[2] = (int)uVar45;
                    uVar45 = uVar45 + 1;
                    puVar50 = puVar50 + 2;
                  } while (uVar39 != uVar45);
                }
              }
            }
            else {
              paVar43 = (aiFace *)0x0;
              uVar42 = 0;
            }
          }
          else {
            uVar23 = *(uint *)(*(long *)(*(long *)&(pvVar9->
                                                  super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                                  )._M_impl + (ulong)(pPVar49->indices).index * 8) +
                              100);
            uVar39 = (ulong)uVar23;
            pAVar40 = *(Accessor **)
                       (*(long *)&(((pPVar49->indices).vector)->
                                  super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                  )._M_impl + (ulong)(pPVar49->indices).index * 8);
            pvVar10 = (pAVar40->bufferView).vector;
            if (pvVar10 == (vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *)0x0) {
LAB_0065b88e:
              local_d8.data = (uint8_t *)0x0;
            }
            else {
              pBVar11 = (pvVar10->
                        super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start[(pAVar40->bufferView).index];
              pvVar12 = (pBVar11->buffer).vector;
              if (pvVar12 == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0)
              goto LAB_0065b88e;
              lVar15 = *(long *)(*(long *)&pvVar12->
                                           super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>
                                + (ulong)(pBVar11->buffer).index * 8);
              lVar13 = *(long *)(lVar15 + 0x60);
              if (lVar13 == 0) goto LAB_0065b88e;
              uVar42 = (ulong)pAVar40->byteOffset + pBVar11->byteOffset;
              puVar29 = *(ulong **)(lVar15 + 0x58);
              if (puVar29 == (ulong *)0x0) {
LAB_0065c07b:
                local_d8.data = (uint8_t *)(lVar13 + uVar42);
              }
              else {
                uVar45 = *puVar29;
                bVar53 = true;
                local_d8.data = (uint8_t *)(uVar42 - uVar45);
                if ((uVar45 <= uVar42) && (uVar42 < uVar45 + puVar29[3])) {
                  local_d8.data = local_d8.data + puVar29[2];
                  bVar53 = false;
                }
                if (bVar53) goto LAB_0065c07b;
              }
            }
            local_d8.accessor = pAVar40;
            uVar20 = glTF::Accessor::GetElementSize(pAVar40);
            local_d8.elemSize = (size_t)uVar20;
            local_d8.stride = (ulong)pAVar40->byteStride;
            if ((ulong)pAVar40->byteStride == 0) {
              local_d8.stride = local_d8.elemSize;
            }
            if (local_d8.data == (uint8_t *)0x0) {
              __assert_fail("data.IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                            ,0x142,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
            }
            switch(pPVar49->mode) {
            case PrimitiveMode_POINTS:
              puVar29 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar29 = uVar39;
              paVar43 = (aiFace *)(puVar29 + 1);
              uVar42 = uVar39;
              if (uVar23 != 0) {
                paVar33 = paVar43;
                do {
                  paVar33->mNumIndices = 0;
                  paVar33->mIndices = (uint *)0x0;
                  paVar33 = paVar33 + 1;
                } while (paVar33 != paVar43 + uVar39);
                uVar45 = 0;
                do {
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar45);
                  *(undefined4 *)(puVar29 + 1) = 1;
                  puVar30 = (uint *)operator_new__(4);
                  puVar29[2] = (ulong)puVar30;
                  *puVar30 = uVar23;
                  uVar45 = uVar45 + 1;
                  puVar29 = puVar29 + 2;
                } while (uVar39 != uVar45);
              }
              break;
            case PrimitiveMode_LINES:
              uVar20 = uVar23;
              if ((uVar23 & 0xfffffffe) != uVar23) {
                pLVar32 = DefaultLogger::get();
                Logger::warn(pLVar32,
                             "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                            );
                uVar20 = uVar23 & 0xfffffffe;
              }
              uVar42 = (ulong)(uVar23 >> 1);
              puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar29 = uVar42;
              paVar43 = (aiFace *)(puVar29 + 1);
              if (1 < uVar23) {
                paVar33 = paVar43;
                do {
                  paVar33->mNumIndices = 0;
                  paVar33->mIndices = (uint *)0x0;
                  paVar33 = paVar33 + 1;
                } while (paVar33 != paVar43 + uVar42);
              }
              if (uVar20 != 0) {
                uVar39 = 0;
                do {
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar39);
                  uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     (&local_d8,(int)uVar39 + 1);
                  *(undefined4 *)(puVar29 + uVar39 + 1) = 2;
                  puVar30 = (uint *)operator_new__(8);
                  puVar29[uVar39 + 2] = (ulong)puVar30;
                  *puVar30 = uVar23;
                  puVar30[1] = uVar22;
                  uVar39 = uVar39 + 2;
                } while (uVar39 < uVar20);
              }
              break;
            case PrimitiveMode_LINE_LOOP:
            case PrimitiveMode_LINE_STRIP:
              uVar20 = uVar23 - (pPVar49->mode == PrimitiveMode_LINE_STRIP);
              uVar42 = (ulong)uVar20;
              puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar29 = uVar42;
              paVar43 = (aiFace *)(puVar29 + 1);
              if (uVar20 != 0) {
                paVar33 = paVar43;
                do {
                  paVar33->mNumIndices = 0;
                  paVar33->mIndices = (uint *)0x0;
                  paVar33 = paVar33 + 1;
                } while (paVar33 != paVar43 + uVar42);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,0);
              uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,1);
              paVar43->mNumIndices = 2;
              puVar30 = (uint *)operator_new__(8);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar22;
              if (2 < uVar23) {
                puVar50 = puVar29 + 4;
                uVar45 = 2;
                do {
                  uVar5 = *(undefined4 *)(puVar50[-2] + 4);
                  uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar45);
                  *(undefined4 *)(puVar50 + -1) = 2;
                  puVar31 = (undefined4 *)operator_new__(8);
                  *puVar50 = (ulong)puVar31;
                  *puVar31 = uVar5;
                  puVar31[1] = uVar20;
                  uVar45 = uVar45 + 1;
                  puVar50 = puVar50 + 2;
                } while (uVar39 != uVar45);
              }
              if (pPVar49->mode == PrimitiveMode_LINE_LOOP) {
                uVar20 = *(uint *)(puVar29[(ulong)(uVar23 - 2) * 2 + 2] + 4);
                uVar22 = *(uint *)puVar29[2];
                paVar43[uVar23 - 1].mNumIndices = 2;
                puVar30 = (uint *)operator_new__(8);
                paVar43[uVar23 - 1].mIndices = puVar30;
                *puVar30 = uVar20;
                puVar30[1] = uVar22;
              }
              break;
            case PrimitiveMode_TRIANGLES:
              uVar42 = uVar39 / 3;
              uVar20 = (uVar23 / 3) * 3;
              uVar22 = uVar23;
              if (uVar20 != uVar23) {
                pLVar32 = DefaultLogger::get();
                Logger::warn(pLVar32,
                             "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                            );
                uVar22 = uVar20;
              }
              puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar29 = uVar42;
              paVar43 = (aiFace *)(puVar29 + 1);
              if (2 < uVar23) {
                paVar33 = paVar43;
                do {
                  paVar33->mNumIndices = 0;
                  paVar33->mIndices = (uint *)0x0;
                  paVar33 = paVar33 + 1;
                } while (paVar33 != paVar43 + uVar42);
              }
              if (uVar22 != 0) {
                uVar23 = 0;
                do {
                  uVar39 = (ulong)uVar23 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar23);
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar23 + 1);
                  uVar24 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar23 + 2);
                  *(undefined4 *)((long)&paVar43->mNumIndices + uVar39) = 3;
                  puVar30 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&paVar43->mIndices + uVar39) = puVar30;
                  *puVar30 = uVar20;
                  puVar30[1] = uVar21;
                  puVar30[2] = uVar24;
                  uVar23 = uVar23 + 3;
                } while (uVar23 < uVar22);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar42 = (ulong)(uVar23 - 2);
              puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar29 = uVar42;
              paVar43 = (aiFace *)(puVar29 + 1);
              if (uVar23 - 2 != 0) {
                paVar33 = paVar43;
                do {
                  paVar33->mNumIndices = 0;
                  paVar33->mIndices = (uint *)0x0;
                  paVar33 = paVar33 + 1;
                } while (paVar33 != paVar43 + uVar42);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,0);
              uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,1);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,2);
              paVar43->mNumIndices = 3;
              puVar30 = (uint *)operator_new__(0xc);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar22;
              puVar30[2] = uVar21;
              if (3 < uVar23) {
                puVar29 = puVar29 + 3;
                uVar45 = 3;
                do {
                  uVar5 = *(undefined4 *)(puVar29[3] + 4);
                  uVar6 = *(undefined4 *)(puVar29[3] + 8);
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar45);
                  *(undefined4 *)puVar29 = 3;
                  puVar31 = (undefined4 *)operator_new__(0xc);
                  puVar29[1] = (ulong)puVar31;
                  *puVar31 = uVar5;
                  puVar31[1] = uVar6;
                  puVar31[2] = uVar23;
                  uVar45 = uVar45 + 1;
                  puVar29 = puVar29 + 2;
                } while (uVar39 != uVar45);
              }
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar42 = (ulong)(uVar23 - 2);
              puVar29 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
              *puVar29 = uVar42;
              paVar43 = (aiFace *)(puVar29 + 1);
              if (uVar23 - 2 != 0) {
                paVar33 = paVar43;
                do {
                  paVar33->mNumIndices = 0;
                  paVar33->mIndices = (uint *)0x0;
                  paVar33 = paVar33 + 1;
                } while (paVar33 != paVar43 + uVar42);
              }
              local_6c = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,0);
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,1);
              uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,2);
              paVar43->mNumIndices = 3;
              puVar30 = (uint *)operator_new__(0xc);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = local_6c;
              puVar30[1] = uVar20;
              puVar30[2] = uVar22;
              if (3 < uVar23) {
                puVar50 = puVar29 + 3;
                uVar45 = 3;
                do {
                  uVar5 = *(undefined4 *)puVar29[2];
                  uVar6 = *(undefined4 *)(puVar50[3] + 8);
                  uVar23 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar45);
                  *(undefined4 *)puVar50 = 3;
                  puVar31 = (undefined4 *)operator_new__(0xc);
                  puVar50[1] = (ulong)puVar31;
                  *puVar31 = uVar5;
                  puVar31[1] = uVar6;
                  puVar31[2] = uVar23;
                  uVar45 = uVar45 + 1;
                  puVar50 = puVar50 + 2;
                } while (uVar39 != uVar45);
              }
              break;
            default:
              paVar43 = (aiFace *)0x0;
              uVar42 = 0;
            }
          }
          if (paVar43 != (aiFace *)0x0) {
            *(aiFace **)(local_b8._M_dataplus._M_p + 0xd0) = paVar43;
            *(uint *)(local_b8._M_dataplus._M_p + 8) = (uint)uVar42;
            bVar53 = (uint)uVar42 == 0;
            if (!bVar53) {
              uVar39 = 0;
              bVar53 = false;
              do {
                uVar45 = (ulong)paVar43[uVar39].mNumIndices;
                if (uVar45 != 0) {
                  if (*(uint *)(local_b8._M_dataplus._M_p + 4) <= *paVar43[uVar39].mIndices) break;
                  uVar47 = 0;
                  do {
                    if (uVar45 - 1 == uVar47) goto LAB_0065c533;
                    uVar2 = uVar47 + 1;
                    lVar15 = uVar47 + 1;
                    uVar47 = uVar2;
                  } while (paVar43[uVar39].mIndices[lVar15] <
                           *(uint *)(local_b8._M_dataplus._M_p + 4));
                  if (uVar2 < uVar45) break;
                }
LAB_0065c533:
                uVar39 = uVar39 + 1;
                bVar53 = uVar42 <= uVar39;
              } while (uVar39 != uVar42);
            }
            if (!bVar53) {
              __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                            ,0x1d5,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
            }
          }
          if ((pPVar49->material).vector !=
              (vector<glTF::Material_*,_std::allocator<glTF::Material_*>_> *)0x0) {
            *(uint *)(local_b8._M_dataplus._M_p + 0xe8) = (pPVar49->material).index;
          }
          local_78 = (ulong)((int)local_78 + 1);
          pPVar49 = (local_e0->primitives).
                    super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar42 = ((long)*(pointer *)
                           ((long)&(local_e0->primitives).
                                   super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                   ._M_impl + 8) - (long)pPVar49 >> 4) * 0x4ec4ec4ec4ec4ec5;
        } while (local_78 <= uVar42 && uVar42 - local_78 != 0);
      }
      uVar51 = uVar51 + 1;
      ppMVar25 = (local_68->meshes).mObjs.
                 super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar51 < ((ulong)((long)(local_68->meshes).mObjs.
                                     super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar25) >>
                       3 & 0xffffffff));
  }
  iVar8._M_current =
       (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets,iVar8,
               &local_e4);
  }
  else {
    *iVar8._M_current = local_e4;
    ppuVar3 = &(this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar3 = *ppuVar3 + 1;
  }
  iVar19._M_current = iStack_90._M_current;
  ppaVar44 = local_98;
  paVar14 = this->mScene;
  uVar23 = (uint)((ulong)((long)iStack_90._M_current - (long)local_98) >> 3);
  paVar14->mNumMeshes = uVar23;
  if (uVar23 != 0) {
    ppaVar36 = (aiMesh **)operator_new__((long)iStack_90._M_current - (long)local_98 & 0x7fffffff8);
    paVar14->mMeshes = ppaVar36;
    for (; ppaVar44 != iVar19._M_current; ppaVar44 = ppaVar44 + 1) {
      paVar26 = *ppaVar44;
      *ppaVar44 = *ppaVar36;
      *ppaVar36 = paVar26;
      ppaVar36 = ppaVar36 + 1;
    }
  }
  if (local_98 != (aiMesh **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void glTFImporter::ImportMeshes(glTF::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

		// Check if mesh extensions is used
		if(mesh.Extension.size() > 0)
		{
			for(Mesh::SExtension* cur_ext : mesh.Extension)
			{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
				if(cur_ext->Type == Mesh::SExtension::EType::Compression_Open3DGC)
				{
					// Limitations for meshes when using Open3DGC-compression.
					// It's a current limitation of sp... Specification have not this part still - about mesh compression. Why only one primitive?
					// Because glTF is very flexibly. But in fact it ugly flexible. Every primitive can has own set of accessors and accessors can
					// point to a-a-a-a-any part of buffer (through bufferview of course) and even to another buffer. We know that "Open3DGC-compression"
					// is applicable only to part of buffer. As we can't guaranty continuity of the data for decoder, we will limit quantity of primitives.
					// Yes indices, coordinates etc. still can br stored in different buffers, but with current specification it's a exporter problem.
					// Also primitive can has only one of "POSITION", "NORMAL" and less then "AI_MAX_NUMBER_OF_TEXTURECOORDS" of "TEXCOORD". All accessor
					// of primitive must point to one continuous region of the buffer.
					if(mesh.primitives.size() > 2) throw DeadlyImportError("GLTF: When using Open3DGC compression then only one primitive per mesh are allowed.");

					Mesh::SCompression_Open3DGC* o3dgc_ext = (Mesh::SCompression_Open3DGC*)cur_ext;
					Ref<Buffer> buf = r.buffers.Get(o3dgc_ext->Buffer);

					buf->EncodedRegion_SetCurrent(mesh.id);
				}
				else
#endif
				{
					throw DeadlyImportError("GLTF: Can not import mesh: unknown mesh extension (code: \"" + to_string(cur_ext->Type) +
											"\"), only Open3DGC is supported.");
				}
			}
		}// if(mesh.Extension.size() > 0)

		meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.id;
            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = attr.position[0]->count;
                attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) attr.normal[0]->ExtractData(aim->mNormals);

            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }


            aiFace* faces = 0;
            unsigned int nFaces = 0;

            if (prim.indices) {
                unsigned int count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        if (nFaces * 2 != count) {
                            ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
                            count = nFaces * 2;
                        }
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        if (nFaces * 3 != count) {
                            ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
                            count = nFaces * 3;
                        }
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks 
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    if (nFaces * 2 != count) {
                        ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
                        count = nFaces * 2;
                    }
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    if (nFaces * 3 != count) {
                        ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
                        count = nFaces * 3;
                    }
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = nFaces;
                ai_assert(CheckValidFacesIndices(faces, nFaces, aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}